

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O3

deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> * __thiscall
ImGuiWS::takeEvents(deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *__return_storage_ptr__,
                   ImGuiWS *this)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)
            ((long)&((this->m_impl)._M_t.
                     super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
                     super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
                     super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->events + 0x50);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    std::_Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::_Deque_base
              (&__return_storage_ptr__->
                super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>,
               (_Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *)
               &((this->m_impl)._M_t.
                 super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
                 super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
                 super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->events);
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::deque<ImGuiWS::Event> ImGuiWS::takeEvents() {
    std::lock_guard<std::mutex> lock(m_impl->events.mutex);
    auto res = std::move(m_impl->events.data);
    return res;
}